

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O2

void __thiscall StripAnsiEscapeCodesStripColors::Run(StripAnsiEscapeCodesStripColors *this)

{
  Test *this_00;
  bool condition;
  string stripped;
  string input;
  string sStack_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "\x1b[1maffixmgr.cxx:286:15: \x1b[0m\x1b[0;1;35mwarning: \x1b[0m\x1b[1musing the result... [-Wparentheses]\x1b[0m"
             ,(allocator<char> *)&sStack_48);
  StripAnsiEscapeCodes(&sStack_48,&local_28);
  this_00 = g_current_test;
  condition = std::operator==("affixmgr.cxx:286:15: warning: using the result... [-Wparentheses]",
                              &sStack_48);
  testing::Test::Check
            (this_00,condition,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/util_test.cc",
             0x198,
             "\"affixmgr.cxx:286:15: warning: using the result... [-Wparentheses]\" == stripped");
  std::__cxx11::string::~string((string *)&sStack_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(StripAnsiEscapeCodes, StripColors) {
  // An actual clang warning.
  string input = "\33[1maffixmgr.cxx:286:15: \33[0m\33[0;1;35mwarning: "
                 "\33[0m\33[1musing the result... [-Wparentheses]\33[0m";
  string stripped = StripAnsiEscapeCodes(input);
  EXPECT_EQ("affixmgr.cxx:286:15: warning: using the result... [-Wparentheses]",
            stripped);
}